

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void fuzzy_check(double a,double b)

{
  double b_local;
  double a_local;
  
  if ((1e-08 <= ABS(a)) || (1e-08 <= ABS(b))) {
    if (ABS(a) <= 1e-08) {
      if (1e-10 <= ABS(ABS(a - b) / ABS(b))) {
        __assert_fail("fabs(fabs(a-b) / fabs(b)) < 1e-10",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_evaluation.cpp"
                      ,0x50,"void fuzzy_check(double, double)");
      }
    }
    else if (1e-10 <= ABS(ABS(a - b) / ABS(a))) {
      __assert_fail("fabs(fabs(a-b) / fabs(a)) < 1e-10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_evaluation.cpp"
                    ,0x4e,"void fuzzy_check(double, double)");
    }
  }
  return;
}

Assistant:

inline void fuzzy_check(double a, double b)
{
  if (fabs(a) < 1e-8 && fabs(b) < 1e-8)
    return;

  if (fabs(a) > 1e-8)
    assert( fabs(fabs(a-b) / fabs(a)) < 1e-10);
  else
    assert( fabs(fabs(a-b) / fabs(b)) < 1e-10);
}